

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

void __thiscall QFontComboBoxPrivate::currentChanged(QFontComboBoxPrivate *this,QString *text)

{
  QFontComboBox *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFontComboBox **)&(this->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFont::families();
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    bVar1 = ::operator!=(local_58.ptr,text);
    if (!bVar1) goto LAB_003dbd38;
  }
  local_40.d = (text->d).d;
  local_40.ptr = (text->d).ptr;
  local_40.size = (text->d).size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  args._M_len = 1;
  args._M_array = (iterator)&local_40;
  QList<QString>::QList((QList<QString> *)&local_70,args);
  QFont::setFamilies((QList_conflict *)&this->currentFont);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QFontComboBox::currentFontChanged(this_00,&this->currentFont);
LAB_003dbd38:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBoxPrivate::currentChanged(const QString &text)
{
    Q_Q(QFontComboBox);
    const QStringList families = currentFont.families();
    if (families.isEmpty() || families.first() != text) {
        currentFont.setFamilies(QStringList{text});
        emit q->currentFontChanged(currentFont);
    }
}